

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnect_on_dtor.cpp
# Opt level: O2

void __thiscall A::A(A *this,signal<void_()> *signal,int *value)

{
  connection cVar1;
  
  (this->m_conn).m_conn.m_signal = (signal_base *)0x0;
  (this->m_conn).m_conn.m_slot = (slot_base *)0x0;
  this->m_value = value;
  cVar1 = obs::signal<void_()>::connect<A>(signal,0x101634,(A *)0x0);
  obs::connection::disconnect((connection *)this);
  (this->m_conn).m_conn = cVar1;
  return;
}

Assistant:

A(obs::signal<void()>& signal, int& value) : m_value(value) {
    m_conn = signal.connect(&A::on_signal, this);
  }